

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalValenceEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  int iVar1;
  pointer pIVar2;
  pointer piVar3;
  MeshEdgebreakerEncoderImplInterface *pMVar4;
  pointer piVar5;
  uint uVar6;
  int iVar7;
  CornerTable *pCVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint local_38;
  int local_34;
  
  this->num_symbols_ = this->num_symbols_ + 1;
  uVar6 = (this->last_corner_).value_;
  uVar9 = (ulong)uVar6;
  if (uVar9 == 0xffffffff) {
    uVar11 = 0xffffffff;
    uVar6 = 0xffffffff;
  }
  else {
    uVar11 = uVar6 - 2;
    if ((uVar6 + 1) % 3 != 0) {
      uVar11 = uVar6 + 1;
    }
    if (uVar6 % 3 == 0) {
      uVar6 = uVar6 + 2;
    }
    else {
      uVar6 = uVar6 - 1;
    }
  }
  uVar10 = (ulong)uVar11;
  pIVar2 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[pIVar2[uVar10].value_];
  switch(symbol) {
  case TOPOLOGY_C:
  case TOPOLOGY_S:
    piVar3[pIVar2[uVar10].value_] = iVar1 + -1;
    piVar3[pIVar2[uVar6].value_] = piVar3[pIVar2[uVar6].value_] + -1;
    if (symbol == TOPOLOGY_S) {
      uVar9 = 0xffffffff;
      if (uVar6 != 0xffffffff) {
        uVar9 = (ulong)(this->corner_table_->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
      }
      iVar13 = 1;
      while ((iVar12 = (int)uVar9, iVar12 != -1 &&
             (pMVar4 = (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_,
             iVar7 = (*pMVar4->_vptr_MeshEdgebreakerEncoderImplInterface[9])
                               (pMVar4,uVar9 / 3,uVar9 % 3), (char)iVar7 == '\0'))) {
        uVar6 = iVar12 + 1;
        if (uVar6 % 3 == 0) {
          uVar6 = iVar12 - 2;
        }
        uVar9 = 0xffffffff;
        if (uVar6 != 0xffffffff) {
          uVar9 = (ulong)(this->corner_table_->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
        }
        iVar13 = iVar13 + 1;
      }
      piVar3 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar3[(this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(this->last_corner_).value_].value_] = iVar13
      ;
      piVar5 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (uVar11 == 0xffffffff) {
        iVar13 = 0;
        uVar9 = 0xffffffff;
        goto LAB_00137e4f;
      }
      pCVar8 = this->corner_table_;
      iVar13 = 0;
      do {
        uVar9 = (ulong)(pCVar8->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
LAB_00137e4f:
        do {
          iVar13 = iVar13 + 1;
          iVar12 = (int)uVar9;
          if (iVar12 == -1) {
LAB_00137ebf:
            local_34 = iVar13;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&(this->vertex_valences_).vector_,&local_34);
            goto switchD_00137d14_caseD_2;
          }
          pMVar4 = (this->super_MeshEdgebreakerTraversalEncoder).encoder_impl_;
          iVar7 = (*pMVar4->_vptr_MeshEdgebreakerEncoderImplInterface[9])(pMVar4,uVar9 / 3);
          if ((char)iVar7 != '\0') goto LAB_00137ebf;
          uVar6 = iVar12 - 2;
          if ((iVar12 + 1U) % 3 != 0) {
            uVar6 = iVar12 + 1U;
          }
          (this->corner_to_vertex_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar6].value_ =
               (uint)((ulong)((long)piVar5 - (long)piVar3) >> 2);
          pCVar8 = this->corner_table_;
          if ((int)(uVar9 % 3) != 0) {
            uVar6 = iVar12 - 1;
            break;
          }
          uVar6 = iVar12 + 2;
          uVar9 = 0xffffffff;
        } while (uVar6 == 0xffffffff);
        uVar10 = (ulong)uVar6;
      } while( true );
    }
    break;
  case TOPOLOGY_L:
    piVar3[pIVar2[uVar9].value_] = piVar3[pIVar2[uVar9].value_] + -1;
    piVar3[pIVar2[uVar10].value_] = piVar3[pIVar2[uVar10].value_] + -2;
    piVar3[pIVar2[uVar6].value_] = piVar3[pIVar2[uVar6].value_] + -1;
    break;
  case TOPOLOGY_R:
    piVar3[pIVar2[uVar9].value_] = piVar3[pIVar2[uVar9].value_] + -1;
    piVar3[pIVar2[uVar10].value_] = piVar3[pIVar2[uVar10].value_] + -1;
    goto LAB_00137e2f;
  case TOPOLOGY_E:
    piVar3[pIVar2[uVar9].value_] = piVar3[pIVar2[uVar9].value_] + -2;
    piVar3[pIVar2[uVar10].value_] = piVar3[pIVar2[uVar10].value_] + -2;
LAB_00137e2f:
    piVar3[pIVar2[uVar6].value_] = piVar3[pIVar2[uVar6].value_] + -2;
  }
switchD_00137d14_caseD_2:
  if ((long)this->prev_symbol_ != -1) {
    iVar13 = this->max_valence_;
    if (iVar1 < this->max_valence_) {
      iVar13 = iVar1;
    }
    iVar12 = 0;
    if (this->min_valence_ <= iVar1) {
      iVar12 = iVar13 - this->min_valence_;
    }
    local_38 = *(uint *)(edge_breaker_topology_to_symbol_id + (long)this->prev_symbol_ * 4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((this->context_symbols_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar12,&local_38);
  }
  this->prev_symbol_ = symbol;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh and compute the context that is going to be
    // used to encode the processed symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh (i.e. the decoding is reverse). Adding a new symbol either reduces
    // valences on the vertices or leaves the valence unchanged.

    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);

    // Get valence on the tip corner of the active edge (outgoing edge that is
    // going to be used in reverse decoding of the connectivity to predict the
    // next symbol).
    const int active_valence = vertex_valences_[corner_to_vertex_map_[next]];
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, we need to split the vertex into
          // two and attach all corners on the left and right sides of the split
          // vertex to the respective vertices (see image below). This is
          // necessary since the decoder works in the reverse order and it
          // merges the two vertices only after the split symbol is processed.
          //
          //     * -----
          //    / \--------
          //   /   \--------
          //  /     \-------
          // *-------v-------*
          //  \     /c\     /
          //   \   /   \   /
          //    \ /n S p\ /
          //     *.......*
          //

          // Count the number of faces on the left side of the split vertex and
          // update the valence on the "left vertex".
          int num_left_faces = 0;
          CornerIndex act_c = corner_table_->Opposite(prev);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_left_faces;
            act_c = corner_table_->Opposite(corner_table_->Next(act_c));
          }
          vertex_valences_[corner_to_vertex_map_[last_corner_]] =
              num_left_faces + 1;

          // Create a new vertex for the right side and count the number of
          // faces that should be attached to this vertex.
          const int new_vert_id = static_cast<int>(vertex_valences_.size());
          int num_right_faces = 0;

          act_c = corner_table_->Opposite(next);
          while (act_c != kInvalidCornerIndex) {
            if (encoder_impl()->IsFaceEncoded(corner_table_->Face(act_c))) {
              break;  // Stop when we reach the first visited face.
            }
            ++num_right_faces;
            // Map corners on the right side to the newly created vertex.
            corner_to_vertex_map_[corner_table_->Next(act_c)] = new_vert_id;
            act_c = corner_table_->Opposite(corner_table_->Previous(act_c));
          }
          vertex_valences_.push_back(num_right_faces + 1);
        }
        break;
      case TOPOLOGY_R:
        // Update valences.
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 1;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      case TOPOLOGY_L:

        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 1;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_to_vertex_map_[last_corner_]] -= 2;
        vertex_valences_[corner_to_vertex_map_[next]] -= 2;
        vertex_valences_[corner_to_vertex_map_[prev]] -= 2;
        break;
      default:
        break;
    }

    if (prev_symbol_ != -1) {
      int clamped_valence;
      if (active_valence < min_valence_) {
        clamped_valence = min_valence_;
      } else if (active_valence > max_valence_) {
        clamped_valence = max_valence_;
      } else {
        clamped_valence = active_valence;
      }

      const int context = clamped_valence - min_valence_;
      context_symbols_[context].push_back(
          edge_breaker_topology_to_symbol_id[prev_symbol_]);
    }

    prev_symbol_ = symbol;
  }